

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void __thiscall
cubeb_resampler_passthrough_duplex_callback_reordering_Test::TestBody
          (cubeb_resampler_passthrough_duplex_callback_reordering_Test *this)

{
  bool bVar1;
  cubeb_resampler *resampler;
  long lVar2;
  stringstream *psVar3;
  ulong uVar4;
  internal *input_frames_count;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  float *input_buffer;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long got;
  long zero;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c90;
  long BUF_BASE_SIZE;
  long frames;
  long prebuffer_frames;
  closure c;
  AssertHelper local_1c68;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  float input_buffer_normal [256];
  float input_buffer_glitch [512];
  float input_buffer_prebuffer [512];
  float output_buffer [512];
  
  input_params.channels = 1;
  input_params.format = CUBEB_SAMPLE_FLOAT32LE;
  input_params.rate = 0xac44;
  output_params.channels = 2;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 0xac44;
  c.input_channel_count = 1;
  resampler = cubeb_resampler_create
                        ((cubeb_stream *)0x0,&input_params,&output_params,0xac44,
                         cb_passthrough_resampler_duplex,&c,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  BUF_BASE_SIZE = 0x100;
  uVar8 = 0x200 / (ulong)input_params.channels;
  if (input_params.channels < 0x201) {
    lVar6 = uVar8 - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar4 = 0;
    auVar14 = _DAT_00133050;
    do {
      bVar1 = SUB164(auVar9 ^ _DAT_00133060,0) < SUB164(auVar14 ^ _DAT_00133060,0);
      iVar11 = SUB164(auVar9 ^ _DAT_00133060,4);
      iVar18 = SUB164(auVar14 ^ _DAT_00133060,4);
      if ((bool)(~(iVar11 < iVar18 || iVar18 == iVar11 && bVar1) & 1)) {
        input_buffer_prebuffer[uVar4] = (float)(long)uVar4;
      }
      if (iVar11 >= iVar18 && (iVar18 != iVar11 || !bVar1)) {
        input_buffer_prebuffer[uVar4 + 1] = (float)(long)(uVar4 + 1);
      }
      uVar4 = uVar4 + 2;
      lVar6 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar6 + 2;
    } while (((int)uVar8 + 1U & 0x7fe) != uVar4);
  }
  prebuffer_frames = uVar8;
  got = cubeb_resampler_fill(resampler,input_buffer_prebuffer,&prebuffer_frames,output_buffer,0x100)
  ;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)input_buffer_glitch,"prebuffer_frames","BUF_BASE_SIZE",&prebuffer_frames,
             &BUF_BASE_SIZE);
  if (input_buffer_glitch[0]._0_1_ == '\0') {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (input_buffer_glitch._8_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)input_buffer_glitch._8_8_;
    }
    iVar11 = 0x2fe;
    input_buffer_normal._0_8_ = psVar3;
  }
  else {
    uVar7 = 0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(input_buffer_glitch + 2),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)input_buffer_glitch,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
    if (input_buffer_glitch[0]._0_1_ != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(input_buffer_glitch + 2),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar6 = 0x100;
      do {
        frames = 0x100;
        if (uVar7 == (uVar7 / 100) * 100 && uVar7 != 0) {
          zero = 0;
LAB_0010a276:
          input_buffer = input_buffer_normal;
          input_frames_count = (internal *)&zero;
        }
        else {
          auVar10._8_4_ = (int)uVar8;
          auVar10._0_8_ = uVar8;
          auVar10._12_4_ = (int)(uVar8 >> 0x20);
          lVar12 = auVar10._8_8_;
          if (uVar7 % 100 != 1) {
            lVar2 = 0;
            lVar13 = 0;
            lVar15 = 1;
            lVar16 = 2;
            lVar17 = 3;
            do {
              *(ulong *)(input_buffer_normal + lVar2) =
                   CONCAT44((float)(lVar15 + lVar12),(float)(long)(lVar13 + uVar8));
              *(ulong *)(input_buffer_normal + lVar2 + 2) =
                   CONCAT44((float)(lVar17 + lVar12),(float)(long)(lVar16 + uVar8));
              lVar2 = lVar2 + 4;
              lVar13 = lVar13 + 4;
              lVar15 = lVar15 + 4;
              lVar16 = lVar16 + 4;
              lVar17 = lVar17 + 4;
            } while (lVar2 != 0x100);
            uVar8 = uVar8 + 0x100;
            zero = 0x100;
            goto LAB_0010a276;
          }
          lVar2 = 0;
          lVar13 = 0;
          lVar15 = 1;
          lVar16 = 2;
          lVar17 = 3;
          do {
            *(ulong *)(input_buffer_glitch + lVar2) =
                 CONCAT44((float)(lVar15 + lVar12),(float)(long)(lVar13 + uVar8));
            *(ulong *)(input_buffer_glitch + lVar2 + 2) =
                 CONCAT44((float)(lVar17 + lVar12),(float)(long)(lVar16 + uVar8));
            lVar2 = lVar2 + 4;
            lVar13 = lVar13 + 4;
            lVar15 = lVar15 + 4;
            lVar16 = lVar16 + 4;
            lVar17 = lVar17 + 4;
          } while (lVar2 != 0x200);
          uVar8 = uVar8 + 0x200;
          frames = 0x200;
          input_buffer = input_buffer_glitch;
          input_frames_count = (internal *)&frames;
        }
        got = cubeb_resampler_fill
                        (resampler,input_buffer,(long *)input_frames_count,output_buffer,0x100);
        is_seq<float>(output_buffer,2,0x100,lVar6);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&zero,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
        if ((char)zero == '\0') {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_1c98.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_1c98.ptr_)->_M_dataplus)._M_p;
          }
          this_00 = &local_1c98;
          local_1c90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,0x31a,pcVar5);
          testing::internal::AssertHelper::operator=(&local_1c68,(Message *)&local_1c90);
          testing::internal::AssertHelper::~AssertHelper(&local_1c68);
          if (local_1c90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_1c90.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1c90.ptr_ + 8))();
            }
            local_1c90.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          goto LAB_0010a460;
        }
        lVar6 = lVar6 + 0x100;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1c98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
        uVar7 = uVar7 + 1;
        if (uVar7 == 300) {
          cubeb_resampler_destroy(resampler);
          return;
        }
      } while( true );
    }
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (input_buffer_glitch._8_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)input_buffer_glitch._8_8_;
    }
    iVar11 = 0x2ff;
    input_buffer_normal._0_8_ = psVar3;
  }
  this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(input_buffer_glitch + 2);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&zero,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,iVar11,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&zero,(Message *)input_buffer_normal);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zero);
  if (input_buffer_normal._0_8_ != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (input_buffer_normal._0_8_ != 0)) {
      (**(code **)(*(long *)input_buffer_normal._0_8_ + 8))();
    }
    input_buffer_normal[0] = 0.0;
    input_buffer_normal[1] = 0.0;
  }
LAB_0010a460:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_duplex_callback_reordering)
{
  // Test that when pre-buffering on resampler creation, we can survive an input
  // callback being delayed.

  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  const int input_channels = 1;
  const int output_channels = 2;

  input_params.channels = input_channels;
  input_params.rate = 44100;
  input_params.format = CUBEB_SAMPLE_FLOAT32NE;

  output_params.channels = output_channels;
  output_params.rate = input_params.rate;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;

  int target_rate = input_params.rate;

  closure c;
  c.input_channel_count = input_channels;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
                           target_rate, cb_passthrough_resampler_duplex, &c,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  const long BUF_BASE_SIZE = 256;
  float input_buffer_prebuffer[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_glitch[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_normal[input_channels * BUF_BASE_SIZE];
  float output_buffer[output_channels * BUF_BASE_SIZE];

  long seq_idx = 0;
  long output_seq_idx = 0;

  long prebuffer_frames = ARRAY_LENGTH(input_buffer_prebuffer) / input_params.channels;
  seq_idx = seq(input_buffer_prebuffer, input_channels, seq_idx,
                prebuffer_frames);

  long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer, &prebuffer_frames,
                                  output_buffer, BUF_BASE_SIZE);

  output_seq_idx += BUF_BASE_SIZE;

  // prebuffer_frames will hold the frames used by the resampler.
  ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
  ASSERT_EQ(got, BUF_BASE_SIZE);

  for (uint32_t i = 0; i < 300; i++) {
    long int frames = BUF_BASE_SIZE;
    // Simulate that sometimes, we don't have the input callback on time
    if (i != 0 && (i % 100) == 0) {
      long zero = 0;
      got = cubeb_resampler_fill(resampler, input_buffer_normal /* unused here */,
                                 &zero, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else if (i != 0 && (i % 100) == 1) {
      // if this is the case, the on the next iteration, we'll have twice the
      // amount of input frames
      seq_idx = seq(input_buffer_glitch, input_channels, seq_idx, BUF_BASE_SIZE * 2);
      frames = 2 * BUF_BASE_SIZE;
      got = cubeb_resampler_fill(resampler, input_buffer_glitch, &frames, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else {
       // normal case
      seq_idx = seq(input_buffer_normal, input_channels, seq_idx, BUF_BASE_SIZE);
      long normal_input_frame_count = 256;
      got = cubeb_resampler_fill(resampler, input_buffer_normal, &normal_input_frame_count, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    }
    ASSERT_EQ(got, BUF_BASE_SIZE);
  }

  cubeb_resampler_destroy(resampler);
}